

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool __thiscall PowerPos<0,_0,_0>::propagate_y(PowerPos<0,_0,_0> *this)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  IntVar *pIVar6;
  IntVar *pIVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int64_t m_v;
  double dVar11;
  double dVar12;
  
  iVar1 = (((this->z).var)->min).v;
  if ((0 < iVar1) && (1 < (((this->x).var)->max).v)) {
    dVar11 = log2((double)iVar1);
    dVar12 = log2((double)(((this->x).var)->max).v);
    dVar11 = ceil(dVar11 / dVar12);
    lVar3 = (long)dVar11;
    pIVar6 = (this->y).var;
    lVar4 = (long)(pIVar6->min).v;
    if (lVar4 < lVar3) {
      pIVar7 = (this->z).var;
      if (lVar3 + -1 == 0) {
        lVar9 = 1;
      }
      else {
        iVar1 = (((this->x).var)->max).v;
        lVar8 = (long)iVar1;
        if (iVar1 == 0) {
          lVar9 = 0;
        }
        else {
          lVar9 = lVar8;
          if (2 < lVar3) {
            lVar10 = lVar3 + -2;
            do {
              lVar9 = lVar9 * lVar8;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
          }
        }
      }
      lVar8 = lVar3 + -1;
      if (lVar9 < (pIVar7->min).v) {
        lVar8 = lVar3;
      }
      if (lVar4 < lVar8) {
        if (so.lazy == true) {
          iVar1 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[8])(pIVar7);
          uVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
          uVar5 = (ulong)uVar2 << 0x20 | (long)iVar1 << 2 | 3;
          pIVar6 = (this->y).var;
        }
        else {
          uVar5 = 0;
        }
        iVar1 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0xe])(pIVar6,lVar8,uVar5,1);
        if ((char)iVar1 == '\0') {
          return false;
        }
      }
    }
  }
  if ((((this->x).var)->min).v < 2) {
    return true;
  }
  dVar11 = log2((double)(((this->z).var)->max).v);
  dVar12 = log2((double)(((this->x).var)->min).v);
  dVar11 = floor(dVar11 / dVar12);
  lVar3 = (long)dVar11;
  if (lVar3 < (((this->y).var)->max).v) {
    pIVar7 = (this->x).var;
    pIVar6 = (this->z).var;
    lVar4 = 1;
    if (lVar3 + 1 != 0) {
      iVar1 = (pIVar7->min).v;
      lVar9 = (long)iVar1;
      if (iVar1 == 0) {
        lVar4 = 0;
      }
      else {
        lVar4 = lVar9;
        lVar8 = lVar3;
        if (0 < lVar3) {
          do {
            lVar4 = lVar4 * lVar9;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
      }
    }
    lVar9 = lVar3 + 1;
    if (lVar4 < (pIVar6->max).v) {
      lVar9 = lVar3;
    }
    if (lVar9 < (pIVar7->max).v) {
      if (so.lazy == true) {
        iVar1 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[9])(pIVar6);
        uVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar5 = (ulong)uVar2 << 0x20 | (long)iVar1 << 2 | 3;
        pIVar7 = (this->x).var;
      }
      else {
        uVar5 = 0;
      }
      iVar1 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xf])(pIVar7,lVar9,uVar5,1);
      if ((char)iVar1 == '\0') {
        return false;
      }
      return true;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate_y() {
		double log_res;
		// Propagation on the lower bound
		if (z.getMin() > 0 && x.getMax() > 1) {
			log_res = log2(z.getMin()) / log2(x.getMax());
			int64_t y_min_new = static_cast<int64_t>(ceil(log_res));
			if (y_min_new > y.getMin()) {
				// Check for numerical errors and correct them
				if (z.getMin() <= my_pow(x.getMax(), y_min_new - 1)) {
					y_min_new--;
				}
				setDom(y, setMin, y_min_new, z.getMinLit(), x.getMaxLit());
			}
		}
		// Propagation on the upper bound
		if (x.getMin() > 1) {
			log_res = log2(z.getMax()) / log2(x.getMin());
			int64_t y_max_new = static_cast<int64_t>(floor(log_res));
			if (y_max_new < y.getMax()) {
				// Check for numerical errors and correct them
				if (z.getMax() <= my_pow(x.getMin(), y_max_new + 1)) {
					y_max_new++;
				}
				setDom(x, setMax, y_max_new, z.getMaxLit(), x.getMinLit());
			}
		}
		return true;
	}